

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MiniParse
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  LimitToken LVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t *puVar6;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  undefined8 ctx_00;
  Nonnull<std::unique_ptr<LogMessageData>_> NVar7;
  bool bVar8;
  ushort uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 in_RAX;
  FieldEntry *pFVar13;
  char *pcVar14;
  undefined7 extraout_var;
  long lVar15;
  unsigned_long *puVar16;
  Nullable<const_char_*> pcVar17;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_04;
  Cord *pCVar18;
  Cord **ppCVar19;
  MicroString *pMVar20;
  string *psVar21;
  undefined7 extraout_var_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar22;
  MessageLite **ppMVar23;
  TcParseTableBase *pTVar24;
  MessageLite *pMVar25;
  Nonnull<const_char_*> pcVar26;
  void *pvVar27;
  MapFieldBaseForParse *pMVar28;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar29;
  code *UNRECOVERED_JUMPTABLE;
  ushort *puVar30;
  short sVar31;
  uint uVar32;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar33;
  Arena *pAVar34;
  uint *puVar35;
  ulong offset;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *entry;
  ParseContext *extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_04;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_05;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_06;
  ParseContext *pPVar36;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  ParseContext *extraout_RDX_09;
  ParseContext *entry_00;
  ParseContext *extraout_RDX_10;
  ParseContext *extraout_RDX_11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar37;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 extraout_RDX_14;
  unsigned_long uVar38;
  int iVar39;
  ulong uVar40;
  uint7 uVar41;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar42;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 msg_00;
  uint16_t uVar43;
  uint64_t uVar44;
  ushort uVar45;
  int iVar46;
  longdouble in_ST0;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view sVar47;
  string_view sVar48;
  byte bStack_a9;
  TcParseTableBase *pTStack_a8;
  TcParseTableBase *pTStack_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_88;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_80;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_78;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_70;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_48;
  LogMessageFatal LStack_40;
  
  uVar40 = (ulong)(byte)*ptr;
  aVar42.data = (long)ptr + 1;
  if (*ptr < '\0') {
    uVar41 = (uint7)((uVar40 << 0x39) >> 8);
    lVar15 = CONCAT71(uVar41,*(char *)aVar42);
    if (*(char *)aVar42 < '\0') {
      uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
      lVar15 = CONCAT71(uVar41,ptr[2]);
      if (ptr[2] < '\0') {
        uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
        lVar15 = CONCAT71(uVar41,ptr[3]);
        if (ptr[3] < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            pcVar14 = Error(msg,ptr,ctx,param_4,table,hasbits);
            return pcVar14;
          }
          uVar40 = CONCAT71(uVar41,ptr[4]) << 0x1c | (ulong)(uVar41 >> 0x1c);
          aVar42.data = (long)ptr + 5;
        }
        else {
          uVar40 = lVar15 << 0x15 | (ulong)(uVar41 >> 0x23);
          aVar42.data = (long)ptr + 4;
        }
      }
      else {
        uVar40 = lVar15 << 0xe | (ulong)(uVar41 >> 0x2a);
        aVar42.data = (long)ptr + 3;
      }
    }
    else {
      uVar40 = lVar15 << 7 | (ulong)(uVar41 >> 0x31);
      aVar42.data = (long)ptr + 2;
    }
  }
  LStack_40.super_LogMessage._0_8_ = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x1c2f04;
  LStack_40.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )in_RAX;
  pFVar13 = FindFieldEntry(table,(uint)(uVar40 >> 3) & 0x1fffffff);
  if (pFVar13 == (FieldEntry *)0x0) {
    pcVar14 = (*table->fallback)(msg,(char *)aVar42,ctx,(TcFieldData)(uVar40 & 0xffffffff),table,
                                 hasbits);
    return pcVar14;
  }
  offset = (ulong)(uint)((int)pFVar13 - (int)table);
  wire_bytes_00._M_len = uVar40 & 0xffffffff;
  aVar33.data = wire_bytes_00._M_len | offset << 0x20;
  uVar12 = (uint)uVar40;
  uVar32 = (uint)hasbits;
  switch(pFVar13->type_card & 0xf) {
  case 0:
    pcVar14 = (*table->fallback)(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  case 1:
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cef77;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar9 = pFVar13->type_card;
    uVar12 = uVar9 & 0x30;
    if (uVar12 == 0x20) {
      pcVar14 = MpRepeatedVarint<false>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if ((uVar40 & 7) == 0) {
      uVar38 = (unsigned_long)*(char *)aVar42;
      if ((long)uVar38 < 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80;
        aVar29.data = (long)*(char *)(aVar42.data + 1) << 7 | 0x7f;
        if ((long)aVar29 < 0) {
          pPVar36 = (ParseContext *)((long)*(char *)(aVar42.data + 2) << 0xe | 0x3fff);
          if ((long)pPVar36 < 0) {
            aVar29.data = aVar29.data & ((long)*(char *)(aVar42.data + 3) << 0x15 | 0x1fffffU);
            if ((long)aVar29 < 0) {
              pPVar36 = (ParseContext *)
                        ((ulong)pPVar36 & ((long)*(char *)(aVar42.data + 4) << 0x1c | 0xfffffffU));
              if ((long)pPVar36 < 0) {
                aVar29.data = aVar29.data &
                              ((long)*(char *)(aVar42.data + 5) << 0x23 | 0x7ffffffffU);
                if ((long)aVar29 < 0) {
                  pPVar36 = (ParseContext *)
                            ((ulong)pPVar36 &
                            ((long)*(char *)(aVar42.data + 6) << 0x2a | 0x3ffffffffffU));
                  if ((long)pPVar36 < 0) {
                    aVar29.data = aVar29.data &
                                  ((long)*(char *)(aVar42.data + 7) << 0x31 | 0x1ffffffffffffU);
                    if ((long)aVar29 < 0) {
                      pPVar36 = (ParseContext *)
                                ((ulong)pPVar36 &
                                ((ulong)*(byte *)(aVar42.data + 8) << 0x38 | 0xffffffffffffff));
                      if ((long)pPVar36 < 0) {
                        wire_bytes_00._M_len = aVar42.data + 10;
                        bVar1 = *(byte *)(aVar42.data + 9);
                        if (bVar1 != 1) {
                          if ((char)bVar1 < '\0') {
                            aStack_70 = aVar42;
                            aStack_68.data = hasbits;
                            aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
                            pcVar14 = Error(msg,(char *)CONCAT71((int7)((ulong)aVar42 >> 8),bVar1),
                                            pPVar36,(TcFieldData)aVar29,table,hasbits);
                            return pcVar14;
                          }
                          if ((bVar1 & 1) == 0) {
                            pPVar36 = (ParseContext *)((ulong)pPVar36 ^ 0x8000000000000000);
                          }
                        }
                      }
                      else {
                        wire_bytes_00._M_len = aVar42.data + 9;
                      }
                    }
                    else {
                      wire_bytes_00._M_len = aVar42.data + 8;
                    }
                  }
                  else {
                    wire_bytes_00._M_len = aVar42.data + 7;
                  }
                }
                else {
                  wire_bytes_00._M_len = aVar42.data + 6;
                }
              }
              else {
                wire_bytes_00._M_len = aVar42.data + 5;
              }
            }
            else {
              wire_bytes_00._M_len = aVar42.data + 4;
            }
          }
          else {
            wire_bytes_00._M_len = aVar42.data + 3;
          }
          aVar29.data = aVar29.data & (ulong)pPVar36;
        }
        else {
          wire_bytes_00._M_len = aVar42.data + 2;
        }
        uVar38 = uVar38 & aVar29.data;
      }
      else {
        wire_bytes_00._M_len = aVar42.data + 1;
      }
      uVar32 = uVar9 & 0x600;
      pPVar36 = (ParseContext *)(ulong)uVar32;
      uVar45 = uVar9 & 0x1c0;
      uVar11 = (uint)uVar38;
      sVar31 = (short)uVar32;
      if (uVar45 == 0xc0) {
        aStack_70 = aVar42;
        aStack_68.data = hasbits;
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (sVar31 == 0x200) {
          uVar38 = -(ulong)(uVar11 & 1) ^ uVar38 >> 1;
        }
      }
      else {
        aStack_70 = aVar42;
        aStack_68.data = hasbits;
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (uVar45 == 0x80) {
          if ((uVar9 >> 10 & 1) == 0) {
            if (sVar31 == 0x200) {
              uVar38 = (unsigned_long)(int)(-(uVar11 & 1) ^ (uint)(uVar38 >> 1) & 0x7fffffff);
            }
          }
          else {
            puVar6 = *(uint32_t **)
                      ((long)&table->has_bits_offset +
                      (ulong)pFVar13->aux_idx * 8 + (ulong)table->aux_offset);
            if (sVar31 == 0x600) {
              if (((int)uVar11 < (int)puVar6) || ((int)((ulong)puVar6 >> 0x20) < (int)uVar11)) {
LAB_001cf1c6:
                pcVar14 = MpUnknownEnumFallback
                                    ((MessageLite *)aStack_58,(char *)aStack_70,
                                     (ParseContext *)aStack_60,(TcFieldData)aVar33,table,
                                     aStack_68.data);
                return pcVar14;
              }
            }
            else {
              aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf1ae;
              aStack_48 = wire_bytes_00._M_len;
              bVar8 = ValidateEnum(uVar11,puVar6);
              wire_bytes_00._M_len = aStack_48;
              if (!bVar8) goto LAB_001cf1c6;
            }
          }
        }
      }
      msg = (MessageLite *)aStack_58;
      if (uVar12 == 0x30) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf0c4;
        ChangeOneof(table,pFVar13,(uint)(aVar33.data >> 3) & 0x1fffffff,pPVar36,
                    (MessageLite *)aStack_58);
      }
      else if (uVar12 == 0x10) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf0a5;
        anon_unknown_105::SetHas(pFVar13,(MessageLite *)aStack_58);
      }
      if (uVar45 == 0xc0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf0da;
        puVar16 = RefAt<unsigned_long>(msg,(ulong)pFVar13->offset);
        *puVar16 = uVar38;
      }
      else if (uVar45 == 0x80) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf0f2;
        puVar35 = RefAt<unsigned_int>(msg,(ulong)pFVar13->offset);
        *puVar35 = (uint)uVar38;
      }
      else {
        LStack_40.super_LogMessage._0_8_ =
             CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
        aStack_50.data = aStack_50.data & 0xffffffffffff;
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf117;
        pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_50 + 6),
                             "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        if (pcVar17 != (Nullable<const_char_*>)0x0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf313;
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&LStack_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x829,pcVar17);
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf31b;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
        }
        *(bool *)((long)msg + (ulong)pFVar13->offset) = uVar38 != 0;
      }
      aVar42 = aStack_68;
      if (*(UntypedMapBase **)aStack_60 <= wire_bytes_00._M_len) {
        if ((ulong)table->has_bits_offset != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf188;
          puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar35 = *puVar35 | (uint)aVar42.data;
        }
        return (char *)wire_bytes_00._M_len;
      }
      uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)wire_bytes_00._M_len;
      if ((uVar12 & 7) != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf25f;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar40 = (ulong)(uVar12 & 0xfffffff8);
      aVar33.data = (ulong)*(ushort *)wire_bytes_00._M_len ^
                    *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
      UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
      hasbits = aStack_68.data;
    }
    else {
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      wire_bytes_00._M_len = aVar42;
      aStack_70 = aVar42;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                        (msg,(char *)wire_bytes_00._M_len,(ParseContext *)aStack_60,
                         (TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  case 2:
    aStack_60.data = 0x1cf3a3;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    if ((uVar12 & 7) != 2) {
      pcVar14 = MpRepeatedVarint<false>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    uVar9 = pFVar13->type_card;
    aStack_50.data = hasbits;
    if ((ulong)table->has_bits_offset != 0) {
      aStack_60.data = 0x1cf3cc;
      puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar35 = *puVar35 | (uint)aStack_50.data;
    }
    uVar45 = uVar9 >> 6 & 7;
    if ((uVar9 >> 6 & 7) == 0) {
      pcVar14 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
      return pcVar14;
    }
    if (uVar45 == 2) {
      switch(uVar9 & 0x600) {
      default:
        pcVar14 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      case 0x200:
      case 0x220:
      case 0x240:
      case 0x260:
      case 0x280:
      case 0x2a0:
      case 0x2c0:
      case 0x2e0:
      case 0x300:
      case 800:
      case 0x340:
      case 0x360:
      case 0x380:
      case 0x3a0:
      case 0x3c0:
      case 0x3e0:
        pcVar14 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      case 0x400:
      case 0x420:
      case 0x440:
      case 0x460:
      case 0x480:
      case 0x4a0:
      case 0x4c0:
      case 0x4e0:
      case 0x500:
      case 0x520:
      case 0x540:
      case 0x560:
      case 0x580:
      case 0x5a0:
      case 0x5c0:
      case 0x5e0:
        pcVar14 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      case 0x600:
      case 0x620:
      case 0x640:
      case 0x660:
      case 0x680:
      case 0x6a0:
      case 0x6c0:
      case 0x6e0:
      case 0x700:
      case 0x720:
      case 0x740:
      case 0x760:
      case 0x780:
      case 0x7a0:
      case 0x7c0:
      case 0x7e0:
        pcVar14 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      }
    }
    if (uVar45 == 3) {
      if ((uVar9 & 0x600) == 0) {
        pcVar14 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      }
      aStack_48.data = CONCAT26(uVar9,aStack_48.data._0_6_) & 0x600ffffffffffff;
      LStack_40.super_LogMessage.errno_saver_.saved_errno_ = 0x200;
      aStack_60.data = 0x1cf421;
      pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,int>
                          ((unsigned_short *)((long)&aStack_48 + 6),(int *)&LStack_40,
                           "xform_val == +field_layout::kTvZigZag");
      if (pcVar17 == (Nullable<const_char_*>)0x0) {
        pcVar14 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                            (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
        return pcVar14;
      }
      aStack_60.data = 0x1cf5a3;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar17);
      aStack_60.data = (uint64_t)&UNK_001cf5ab;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
    }
    aStack_60.data = 0x1cf587;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x8f9);
  case 3:
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf5dd;
    aVar29.data = aVar33.data;
    aStack_68.data = hasbits;
    wire_bytes_00._M_len =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar9 = *(uint16_t *)(wire_bytes_00._M_len + 10);
    uVar45 = uVar9 & 0x30;
    if (uVar45 == 0x20) {
      pcVar14 = MpRepeatedFixed<false>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,(uint64_t)aStack_68);
      return pcVar14;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if ((uVar9 & 0x1c0) == 0xc0) {
      aStack_60 = aVar42;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      if ((uVar12 & 7) != 1) {
LAB_001cf6b4:
        UNRECOVERED_JUMPTABLE_04 = table->fallback;
        aVar29 = aStack_60;
        aVar37 = aStack_50;
        aVar42 = aStack_68;
        goto LAB_001cf75c;
      }
    }
    else {
      LStack_40.super_LogMessage._0_8_ =
           CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
      aStack_58.data._6_2_ = 0x80;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf696;
      aStack_60 = aVar42;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48 = wire_bytes_00._M_len;
      pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_58 + 6),
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if (pcVar17 != (Nullable<const_char_*>)0x0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf7ae;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar17);
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf7b6;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
      }
      wire_bytes_00._M_len = aStack_48;
      if ((uVar12 & 7) != 5) goto LAB_001cf6b4;
    }
    aVar37 = aStack_50;
    aVar42 = aStack_68;
    if (uVar45 == 0x30) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf6ef;
      ChangeOneof(table,(FieldEntry *)wire_bytes_00._M_len,uVar12 >> 3,(ParseContext *)aVar29,
                  (MessageLite *)aStack_50);
    }
    else if (uVar45 == 0x10) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf66f;
      anon_unknown_105::SetHas((FieldEntry *)wire_bytes_00._M_len,(MessageLite *)aStack_50);
    }
    aVar29 = aStack_60;
    if ((uVar9 & 0x1c0) == 0xc0) {
      uVar38 = *(unsigned_long *)aStack_60;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf70e;
      puVar16 = RefAt<unsigned_long>((void *)aVar37,(ulong)*(uint *)wire_bytes_00._M_len);
      *puVar16 = uVar38;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x8;
    }
    else {
      LVar2.token_ = *(int *)aStack_60;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf721;
      puVar35 = RefAt<unsigned_int>((void *)aVar37,(ulong)*(uint *)wire_bytes_00._M_len);
      *puVar35 = LVar2.token_;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x4;
    }
    aVar29.data = aVar29.data + aStack_80.data;
    if ((UntypedMapBase *)((EpsCopyInputStream *)aStack_70)->limit_end_ <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf77d;
        puVar35 = RefAt<unsigned_int>((void *)aVar37,(ulong)table->has_bits_offset);
        *puVar35 = *puVar35 | aVar42._0_4_;
      }
      return (char *)aVar29.data;
    }
    uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar12 & 7) != 0) {
      aStack_80.data = (uint64_t)MpPackedFixed<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar12 & 0xfffffff8);
    aVar33.data = (ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
    UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
LAB_001cf75c:
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                        ((MessageLite *)aVar37,(char *)aVar29,(ParseContext *)aStack_70,
                         (TcFieldData)aVar33,table,aVar42.data);
    return pcVar14;
  case 4:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf802;
    aStack_58 = aVar42;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    if ((uVar12 & 7) != 2) {
      pcVar14 = MpRepeatedFixed<false>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    uVar9 = pFVar13->type_card;
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf827;
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    aStack_48 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    uVar10 = ReadSize((char **)&aStack_58);
    if ((uVar9 & 0x1c0) == 0xc0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf844;
      aVar42.data = (uint64_t)
                    RefAt<google::protobuf::RepeatedField<unsigned_long>>
                              (aStack_60.data,(ulong)pFVar13->offset);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf856;
      aVar33.data = (uint64_t)
                    EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                              (&ctx->super_EpsCopyInputStream,aStack_58.data,uVar10,
                               (RepeatedField<unsigned_long> *)aVar42);
      pPVar36 = extraout_RDX;
    }
    else {
      LStack_40.super_LogMessage._0_8_ =
           CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
      aStack_50.data._6_2_ = 0x80;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf89b;
      pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_50 + 6),
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if (pcVar17 != (Nullable<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf979;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar17);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf981;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf8b2;
      aVar42.data = (uint64_t)
                    RefAt<google::protobuf::RepeatedField<unsigned_int>>
                              (aStack_60.data,(ulong)pFVar13->offset);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf8c4;
      aVar33.data = (uint64_t)
                    EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                              (&ctx->super_EpsCopyInputStream,aStack_58.data,uVar10,
                               (RepeatedField<unsigned_int> *)aVar42);
      pPVar36 = extraout_RDX_00;
    }
    if ((ushort *)aVar33.data == (ushort *)0x0) {
      wire_bytes_00._M_len = aStack_58;
      aStack_58 = aVar33;
      pcVar14 = Error((MessageLite *)aStack_60,(char *)wire_bytes_00._M_len,pPVar36,
                      (TcFieldData)aVar42,(TcParseTableBase *)aStack_48,hasbits);
      return pcVar14;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= aVar33.data) {
      if ((ulong)*(ushort *)aStack_48 != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cf92d;
        aStack_58 = aVar33;
        puVar35 = RefAt<unsigned_int>((void *)aStack_60,(ulong)*(ushort *)aStack_48);
        *puVar35 = *puVar35 | uVar32;
      }
      return (char *)aVar33.data;
    }
    uVar12 = (uint)*(uint8_t *)(aStack_48.data + 8) & (uint)*(ushort *)aVar33;
    if ((uVar12 & 7) == 0) {
      uVar40 = (ulong)(uVar12 & 0xfffffff8);
      aStack_58 = aVar33;
      pcVar14 = (char *)(**(code **)(aStack_48.data + uVar40 * 2 + 0x38))
                                  (aStack_60.data,aVar33.data,ctx,
                                   (ulong)*(ushort *)aVar33 ^
                                   *(ulong *)((uint8_t *)(aStack_48.data + 0x40) + uVar40 * 2),
                                   aStack_48.data,hasbits);
      return pcVar14;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_001cf999;
    aStack_58 = aVar33;
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  case 6:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfd69;
    aStack_60 = aVar42;
    aStack_58.data = hasbits;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar43 = pFVar13->type_card;
    uVar9 = uVar43 & 0x30;
    if (uVar9 == 0x20) {
      if ((uVar43 & 0x1c0) == 0x40) {
        pcVar14 = MpRepeatedMessageOrGroup<false,true>
                            (msg,(char *)aStack_60,ctx,(TcFieldData)aVar33,table,aStack_58.data);
        return pcVar14;
      }
      if ((uVar43 & 0x1c0) == 0) {
        pcVar14 = MpRepeatedMessageOrGroup<false,false>
                            (msg,(char *)aStack_60,ctx,(TcFieldData)aVar33,table,aStack_58.data);
        return pcVar14;
      }
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      goto LAB_001cfe4e;
    }
    uVar32 = uVar12 & 7;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if ((uVar43 & 0x1c0) == 0x40) {
      if (uVar32 != 3) goto LAB_001cfe2c;
    }
    else if (((uVar43 & 0x1c0) != 0) || (uVar32 != 2)) {
LAB_001cfe2c:
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
LAB_001cfe4e:
      pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                          (msg,(char *)aStack_60,ctx,(TcFieldData)aVar33,table,aStack_58.data);
      return pcVar14;
    }
    if (uVar9 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfe7d;
      bVar8 = ChangeOneof(table,pFVar13,(uint32_t)(wire_bytes_00._M_len >> 3),
                          (ParseContext *)(ulong)uVar32,msg);
      aStack_68.data._4_4_ = (int)CONCAT71(extraout_var,bVar8);
    }
    else {
      if (uVar9 == 0x10) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfdf1;
        anon_unknown_105::SetHas(pFVar13,msg);
      }
      aStack_68.data._4_4_ = 0;
    }
    if ((ulong)table->has_bits_offset != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfe93;
      puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar35 = *puVar35 | (uint)aStack_58.data;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfea5;
    ppMVar23 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)pFVar13->offset);
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfebf;
    pTVar24 = GetTableFromAux(uVar43,*(FieldAux *)
                                      ((long)&table->has_bits_offset +
                                      (ulong)pFVar13->aux_idx * 8 + (ulong)table->aux_offset));
    pMVar25 = *ppMVar23;
    if ((byte)(aStack_68._4_1_ | pMVar25 == (MessageLite *)0x0) == 1) {
      pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar34 & 1) != 0) {
        pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cfeef;
      pMVar25 = ClassData::New(pTVar24->class_data,pAVar34);
      *ppMVar23 = pMVar25;
    }
    aVar42 = aStack_50;
    if ((uVar43 & 0x1c0) == 0x40) {
      iVar39 = *(int *)(aStack_50.data + 0x58);
      iVar46 = iVar39 + -1;
      *(int *)(aStack_50.data + 0x58) = iVar46;
      if (0 < iVar39) {
        iVar39 = *(int *)(aStack_50.data + 0x5c) + 1;
        *(int *)(aStack_50.data + 0x5c) = iVar39;
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cff37;
        pcVar14 = ParseLoopPreserveNone(pMVar25,(char *)aStack_60,(ParseContext *)aStack_50,pTVar24)
        ;
        if (pcVar14 == (char *)0x0) {
LAB_001cff78:
          *(ulong *)(aVar42.data + 0x58) =
               CONCAT44((int)((ulong)*(undefined8 *)(aVar42.data + 0x58) >> 0x20) + -1,
                        (int)*(undefined8 *)(aVar42.data + 0x58) + 1);
          uVar32 = *(uint32_t *)(aVar42.data + 0x50);
          *(uint32_t *)(aVar42.data + 0x50) = 0;
          if (uVar32 != uVar12) {
            return (char *)0x0;
          }
          return pcVar14;
        }
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cff53;
        pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                            (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_");
        if (pcVar26 == (Nullable<const_char_*>)0x0) {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cff6f;
          pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar39,*(int *)(aVar42.data + 0x5c),"old_group_depth == group_depth_"
                              );
          if (pcVar26 == (Nullable<const_char_*>)0x0) goto LAB_001cff78;
          iVar46 = 0x492;
        }
        else {
          iVar46 = 0x491;
        }
LAB_001d00a5:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d00ad;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar46,pcVar26);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_001d00b5;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_48);
      }
    }
    else {
      aStack_48 = aStack_60;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cffbc;
      ReadSize((char **)&aStack_48);
      aVar42 = aStack_50;
      if (((UntypedMapBase *)aStack_48.data != (UntypedMapBase *)0x0) &&
         (0 < *(int *)(aStack_50.data + 0x58))) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1cffe2;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)
                   ((long)&LStack_40.super_LogMessage.data_._M_t.
                           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl + 4),(char *)aStack_50,(int)aStack_48.data);
        iVar46 = *(int *)(aVar42.data + 0x58) + -1;
        *(int *)(aVar42.data + 0x58) = iVar46;
        if ((UntypedMapBase *)aStack_48.data != (UntypedMapBase *)0x0) {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0009;
          pcVar14 = ParseLoopPreserveNone
                              (*ppMVar23,(char *)aStack_48,(ParseContext *)aVar42,pTVar24);
          if (pcVar14 != (char *)0x0) {
            aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0024;
            pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_");
            if (pcVar26 != (Nullable<const_char_*>)0x0) {
              iVar46 = 0x481;
              goto LAB_001d00a5;
            }
          }
          *(int *)(aVar42.data + 0x58) = *(int *)(aVar42.data + 0x58) + 1;
          aStack_48.data._0_4_ =
               LStack_40.super_LogMessage.data_._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl._4_4_;
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d003c;
          bVar8 = EpsCopyInputStream::PopLimit
                            ((EpsCopyInputStream *)aVar42,(LimitToken *)&aStack_48);
          if (!bVar8) {
            return (char *)0x0;
          }
          return pcVar14;
        }
      }
    }
    return (char *)0x0;
  case 7:
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(uint16_t *)(aStack_58.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar12 & 7) != 2)) {
      pcVar14 = MpFallback(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    uVar3 = *(undefined4 *)
             ((long)&table->has_bits_offset +
             (ulong)*(uint16_t *)(aStack_58.data + 8) * 8 + (ulong)table->aux_offset);
    if ((bStack_a9 & 2) == 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      pMVar28 = RefAt<google::protobuf::internal::MapFieldBaseForParse>
                          (msg,(ulong)*(uint *)aStack_58);
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)MapFieldBaseForParse::MutableMap(pMVar28);
    }
    else {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               RefAt<google::protobuf::internal::UntypedMapBase>(msg,(ulong)*(uint *)aStack_58);
    }
    puVar35._4_1_ = bStack_a9;
    puVar35._0_4_ = uVar3;
    puVar35._5_3_ = 0;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar35;
    do {
      aVar29.data = (uint64_t)UntypedMapBase::AllocNode(aVar33.data);
      uVar40 = (ulong)((TypeInfo *)(aVar33.data + 0xc))->node_size;
      aStack_78.data = uVar40 - 8;
      aStack_48.data = 8;
      pcVar26 = absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                          ((long *)&aStack_78.data,&aStack_48.data,
                           "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
      if (pcVar26 != (Nullable<const_char_*>)0x0) {
        pcVar14 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar46 = 0xb2c;
LAB_001d05a3:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_78,pcVar14,iVar46,pcVar26);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_78);
      }
      *(undefined8 *)(aVar29.data + 8) = 0;
      *(undefined8 *)((long)(aVar29.data - 8) + uVar40) = 0;
      pcVar14 = (char *)aVar29;
      UntypedMapBase::
      VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
                ((UntypedMapBase *)aVar33,(NodeBase *)aVar29,
                 (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                  )aVar33);
      LStack_40.super_LogMessage._0_8_ = &aStack_88;
      aStack_68.data = (uint64_t)&aStack_80;
      f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
             *)&aStack_48;
      f.this = (UntypedMapBase *)aVar33.data;
      f.node = (NodeBase **)aStack_68.data;
      aStack_80 = aVar29;
      aStack_78 = aVar33;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&aStack_48;
      aStack_48 = aVar33;
      LStack_40.super_LogMessage.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )aVar33;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar33,f);
      aStack_78 = aVar42;
      uVar10 = ReadSize((char **)&aStack_78);
      aVar42 = aStack_60;
      aVar37 = aStack_78;
      if (((UntypedMapBase *)aStack_78.data == (UntypedMapBase *)0x0) ||
         (*(int *)(aStack_60.data + 0x58) < 1)) {
LAB_001d0499:
        if (*(Arena **)(aVar33.data + 0x18) == (Arena *)0x0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)aVar33,(NodeBase *)aVar29);
          aVar37 = extraout_RDX_06;
          pcVar14 = (char *)aVar29;
        }
        pcVar14 = Error(msg,pcVar14,(ParseContext *)aVar37,(TcFieldData)puVar35,table,hasbits);
        return pcVar14;
      }
      puVar35._4_4_ = 0;
      puVar35._0_4_ = uVar10;
      EpsCopyInputStream::PushLimit
                ((EpsCopyInputStream *)&aStack_48,(char *)aStack_60,(int)aStack_78.data);
      uVar3 = aStack_48.data._0_4_;
      iVar46 = *(int *)(aVar42.data + 0x58) + -1;
      *(int *)(aVar42.data + 0x58) = iVar46;
      aVar37 = extraout_RDX_04;
      pcVar14 = (char *)aStack_78;
      if ((UntypedMapBase *)aStack_78.data == (UntypedMapBase *)0x0) goto LAB_001d0499;
      puVar35 = (uint *)aStack_88;
      pTVar24 = table;
      wire_bytes._M_len = aStack_58;
      puVar30 = (ushort *)
                ParseOneMapEntry((NodeBase *)aVar29,(char *)aStack_78,(ParseContext *)aVar42,
                                 (FieldAux *)aStack_88,table,(FieldEntry *)aStack_58,
                                 (UntypedMapBase *)aVar33);
      if ((puVar30 != (ushort *)0x0) &&
         (pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_"),
         pcVar26 != (Nullable<const_char_*>)0x0)) {
        pcVar14 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
        ;
        iVar46 = 0x481;
        goto LAB_001d05a3;
      }
      *(int *)(aVar42.data + 0x58) = *(int *)(aVar42.data + 0x58) + 1;
      aStack_80.data._0_4_ = uVar3;
      pcVar14 = (char *)&aStack_80;
      msg_00 = aVar42;
      bVar8 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)aVar42,(LimitToken *)pcVar14);
      aVar37 = extraout_RDX_05;
      if ((!bVar8) || (puVar30 == (ushort *)0x0)) goto LAB_001d0499;
      if ((bStack_a9 & 0x10) == 0) {
LAB_001d0334:
        if (5 < (SUB41(*(TypeInfo *)(aVar33.data + 0xc),3) & 0xf)) {
switchD_001d0359_caseD_3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        }
        uVar11 = (uint)*(TypeInfo *)(aVar33.data + 0xc) >> 0x18 & 0xf;
        puVar35 = &switchD_001d0359::switchdataD_0027077c;
        UNRECOVERED_JUMPTABLE =
             (code *)((long)&switchD_001d0359::switchdataD_0027077c +
                     (long)(int)(&switchD_001d0359::switchdataD_0027077c)[uVar11]);
        pTStack_a8 = (TcParseTableBase *)msg;
        pTStack_a0 = table;
        switch(uVar11) {
        case 0:
          KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar33,(KeyNode *)aVar29);
          break;
        case 1:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)aVar33,(KeyNode *)aVar29);
          break;
        case 2:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)aVar33,(KeyNode *)aVar29);
          break;
        default:
          goto switchD_001d0359_caseD_3;
        case 5:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)aVar33,(KeyNode *)aVar29);
          break;
        case 6:
          LOCK();
          uVar3 = *(undefined4 *)(aVar33.data + 2);
          *(undefined4 *)(aVar33.data + 2) = (int)puVar30;
          puVar30 = (ushort *)CONCAT44((int)((ulong)puVar30 >> 0x20),uVar3);
          UNLOCK();
          *UNRECOVERED_JUMPTABLE =
               (code)((char)*UNRECOVERED_JUMPTABLE + (char)UNRECOVERED_JUMPTABLE);
          goto code_r0x001d19af;
        case 7:
          sRam0000000000c32562 = (short)in_ST0;
          goto code_r0x001d19d5;
        case 8:
          *(uint *)UNRECOVERED_JUMPTABLE =
               *(uint *)UNRECOVERED_JUMPTABLE | (uint)UNRECOVERED_JUMPTABLE;
          goto code_r0x001d19af;
        case 9:
        case 10:
          goto switchD_001d0359_caseD_9;
        case 0xb:
          sRam0000000000c32562 = (short)in_ST0;
          goto code_r0x001d19c8;
        case 0xc:
          out((short)aVar37.data,(char)UNRECOVERED_JUMPTABLE);
          goto switchD_001d19c0_caseD_6;
        case 0xd:
          goto switchD_001d19c0_caseD_9;
        case 0xe:
          pcVar14 = MpRepeatedVarintT<false,bool,(unsigned_short)0>
                              ((MessageLite *)msg_00,pcVar14,(ParseContext *)aVar37,
                               (TcFieldData)0x27077c,pTVar24,wire_bytes._M_len);
          return pcVar14;
        case 0xf:
          goto switchD_001d19c0_caseD_8;
        }
      }
      else {
        puVar35 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar33,(NodeBase *)aVar29)
        ;
        uVar11 = *puVar35;
        puVar35 = *(uint **)(aStack_88.data + 8);
        pcVar14 = (char *)(long)(short)*puVar35;
        msg_00.data._0_4_ = *puVar35 >> 0x10;
        msg_00.data._4_4_ = 0;
        aVar37.data = ((long)(int)uVar11 - (long)pcVar14) - msg_00.data;
        if ((UntypedMapBase *)((long)(int)uVar11 - (long)pcVar14) < msg_00.data) goto LAB_001d0334;
        uVar4 = puVar35[1];
        pcVar14._4_4_ = 0;
        pcVar14._0_4_ = uVar4;
        msg_00.data._2_6_ = 0;
        msg_00.data._0_2_ = (ushort)uVar4;
        if (msg_00.data <= aVar37.data) {
          aVar37.data._4_4_ = 0;
          aVar37.data._0_4_ = uVar4 >> 0x10;
          pcVar14 = (char *)0x0;
          do {
            if (aVar37.data <= pcVar14) goto LAB_001d03e8;
            uVar5 = *(uint *)((long)puVar35 + (long)pcVar14 * 4 + (ulong)(uVar4 >> 3 & 0x1ffc) + 8);
            msg_00.data._4_4_ = 0;
            msg_00.data._0_4_ = uVar5;
            pTVar24 = (TcParseTableBase *)(ulong)((int)uVar11 < (int)uVar5);
            pcVar14 = (char *)(((long)pcVar14 * 2 - (long)pTVar24) + 2);
          } while (uVar5 != uVar11);
          goto LAB_001d0334;
        }
        if ((puVar35[(aVar37.data >> 5) + 2] >> ((uint)aVar37.data & 0x1f) & 1) != 0)
        goto LAB_001d0334;
LAB_001d03e8:
        puVar35 = (uint *)wire_bytes_00._M_len;
        WriteMapEntryAsUnknown
                  (msg,table,(UntypedMapBase *)aVar33,uVar12,(NodeBase *)aVar29,
                   SUB85(aStack_50.data,0));
      }
      if (*(ushort **)aVar42 <= puVar30) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar35 = *puVar35 | uVar32;
        }
        return (char *)puVar30;
      }
      bVar1 = (byte)*puVar30;
      uVar11 = (uint)bVar1;
      aVar42.data = (long)puVar30 + 1;
      if ((char)bVar1 < '\0') {
        uVar41 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
        lVar15 = CONCAT71(uVar41,*(char *)aVar42);
        if (*(char *)aVar42 < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
          lVar15 = CONCAT71(uVar41,(byte)puVar30[1]);
          if ((char)(byte)puVar30[1] < '\0') {
            uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
            lVar15 = CONCAT71(uVar41,*(byte *)((long)puVar30 + 3));
            if ((char)*(byte *)((long)puVar30 + 3) < '\0') {
              uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
              if ((char)(byte)puVar30[2] < '\0') {
                uVar11 = 0;
                aVar42.data = 0;
              }
              else {
                uVar11 = (int)CONCAT71(uVar41,(byte)puVar30[2]) << 0x1c | (uint)(uVar41 >> 0x1c);
                aVar42.data = (long)puVar30 + 5;
              }
            }
            else {
              uVar11 = (int)lVar15 << 0x15 | (uint)(uVar41 >> 0x23);
              aVar42.data = (uint64_t)(puVar30 + 2);
            }
          }
          else {
            uVar11 = (int)lVar15 << 0xe | (uint)(uVar41 >> 0x2a);
            aVar42.data = (long)puVar30 + 3;
          }
        }
        else {
          uVar11 = (int)lVar15 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
          aVar42.data = (uint64_t)(puVar30 + 1);
        }
      }
      if (uVar11 != uVar12) {
        uVar12 = (uint)table->fast_idx_mask & (uint)*puVar30;
        if ((uVar12 & 7) == 0) {
          uVar40 = (ulong)(uVar12 & 0xfffffff8);
          pcVar14 = (char *)(**(code **)(&table[1].has_bits_offset + uVar40))
                                      (msg,puVar30,aStack_60.data,
                                       (ulong)*puVar30 ^
                                       *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2),table,
                                       hasbits);
          return pcVar14;
        }
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
    } while( true );
  case 8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar35 = *puVar35 | uVar32;
    }
    return (char *)0x0;
  case 9:
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d060b;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar9 = pFVar13->type_card;
    uVar12 = uVar9 & 0x30;
    if (uVar12 == 0x20) {
      pcVar14 = MpRepeatedVarint<true>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    if ((uVar40 & 7) == 0) {
      wire_bytes_00._M_len = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar42;
      if ((long)wire_bytes_00._M_len < 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0xffffffffffffff80;
        aVar29.data = (long)*(char *)(aVar42.data + 1) << 7 | 0x7f;
        if ((long)aVar29 < 0) {
          pPVar36 = (ParseContext *)((long)*(char *)(aVar42.data + 2) << 0xe | 0x3fff);
          if ((long)pPVar36 < 0) {
            aVar29.data = aVar29.data & ((long)*(char *)(aVar42.data + 3) << 0x15 | 0x1fffffU);
            if ((long)aVar29 < 0) {
              pPVar36 = (ParseContext *)
                        ((ulong)pPVar36 & ((long)*(char *)(aVar42.data + 4) << 0x1c | 0xfffffffU));
              if ((long)pPVar36 < 0) {
                aVar29.data = aVar29.data &
                              ((long)*(char *)(aVar42.data + 5) << 0x23 | 0x7ffffffffU);
                if ((long)aVar29 < 0) {
                  pPVar36 = (ParseContext *)
                            ((ulong)pPVar36 &
                            ((long)*(char *)(aVar42.data + 6) << 0x2a | 0x3ffffffffffU));
                  if ((long)pPVar36 < 0) {
                    aVar29.data = aVar29.data &
                                  ((long)*(char *)(aVar42.data + 7) << 0x31 | 0x1ffffffffffffU);
                    if ((long)aVar29 < 0) {
                      pPVar36 = (ParseContext *)
                                ((ulong)pPVar36 &
                                ((ulong)*(byte *)(aVar42.data + 8) << 0x38 | 0xffffffffffffff));
                      if ((long)pPVar36 < 0) {
                        aStack_68.data = aVar42.data + 10;
                        bVar1 = *(byte *)(aVar42.data + 9);
                        if (bVar1 != 1) {
                          if ((char)bVar1 < '\0') {
                            aStack_70 = aVar42;
                            aStack_60.data = hasbits;
                            aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
                            aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
                            pcVar14 = Error(msg,(char *)CONCAT71((int7)((ulong)aStack_68 >> 8),bVar1
                                                                ),pPVar36,(TcFieldData)aVar29,table,
                                            hasbits);
                            return pcVar14;
                          }
                          if ((bVar1 & 1) == 0) {
                            pPVar36 = (ParseContext *)((ulong)pPVar36 ^ 0x8000000000000000);
                          }
                        }
                      }
                      else {
                        aStack_68.data = aVar42.data + 9;
                      }
                    }
                    else {
                      aStack_68.data = aVar42.data + 8;
                    }
                  }
                  else {
                    aStack_68.data = aVar42.data + 7;
                  }
                }
                else {
                  aStack_68.data = aVar42.data + 6;
                }
              }
              else {
                aStack_68.data = aVar42.data + 5;
              }
            }
            else {
              aStack_68.data = aVar42.data + 4;
            }
          }
          else {
            aStack_68.data = aVar42.data + 3;
          }
          aVar29.data = aVar29.data & (ulong)pPVar36;
        }
        else {
          aStack_68.data = aVar42.data + 2;
        }
        wire_bytes_00._M_len = wire_bytes_00._M_len & aVar29.data;
      }
      else {
        aStack_68.data = aVar42.data + 1;
      }
      uVar32 = uVar9 & 0x600;
      pPVar36 = (ParseContext *)(ulong)uVar32;
      uVar45 = uVar9 & 0x1c0;
      uVar11 = (uint)wire_bytes_00._M_len;
      sVar31 = (short)uVar32;
      if (uVar45 == 0xc0) {
        aStack_60.data = hasbits;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        if (sVar31 == 0x200) {
          wire_bytes_00._M_len = -(ulong)(uVar11 & 1) ^ wire_bytes_00._M_len >> 1;
        }
      }
      else {
        aStack_60.data = hasbits;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        if (uVar45 == 0x80) {
          if ((uVar9 >> 10 & 1) == 0) {
            if (sVar31 == 0x200) {
              wire_bytes_00._M_len =
                   (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   (long)(int)(-(uVar11 & 1) ^ (uint)(wire_bytes_00._M_len >> 1) & 0x7fffffff);
            }
          }
          else {
            puVar6 = *(uint32_t **)
                      ((long)&table->has_bits_offset +
                      (ulong)pFVar13->aux_idx * 8 + (ulong)table->aux_offset);
            if (sVar31 == 0x600) {
              aStack_70 = aVar42;
              if (((int)uVar11 < (int)puVar6) || ((int)((ulong)puVar6 >> 0x20) < (int)uVar11)) {
LAB_001d0875:
                pcVar14 = MpUnknownEnumFallback
                                    ((MessageLite *)aStack_50,(char *)aStack_70,
                                     (ParseContext *)aStack_58,(TcFieldData)aVar33,table,
                                     aStack_60.data);
                return pcVar14;
              }
            }
            else {
              aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0862;
              aStack_70 = aVar42;
              bVar8 = ValidateEnum(uVar11,puVar6);
              if (!bVar8) goto LAB_001d0875;
            }
          }
        }
      }
      msg = (MessageLite *)aStack_50;
      aStack_70 = wire_bytes_00._M_len;
      if (uVar12 == 0x30) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0762;
        ChangeOneof(table,pFVar13,(uint)(aVar33.data >> 3) & 0x1fffffff,pPVar36,
                    (MessageLite *)aStack_50);
      }
      else if (uVar12 == 0x10) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0743;
        anon_unknown_105::SetHas(pFVar13,(MessageLite *)aStack_50);
      }
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0770;
      pvVar27 = MaybeGetSplitBase(msg,true,table);
      if (uVar45 == 0xc0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0786;
        paVar22 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                  RefAt<unsigned_long>(pvVar27,(ulong)pFVar13->offset);
        paVar22->data = (uint64_t)aStack_70;
      }
      else if (uVar45 == 0x80) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d07a3;
        puVar35 = RefAt<unsigned_int>(pvVar27,(ulong)pFVar13->offset);
        *puVar35 = (uint)aStack_70.data;
      }
      else {
        LStack_40.super_LogMessage._0_8_ =
             CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
        aStack_48.data = aStack_48.data & 0xffffffffffff;
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d07ca;
        pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_48 + 6),
                             "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        if (pcVar17 != (Nullable<const_char_*>)0x0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d09d5;
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&LStack_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x829,pcVar17);
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d09dd;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
        }
        *(bool *)((long)pvVar27 + (ulong)pFVar13->offset) =
             (UntypedMapBase *)aStack_70.data != (UntypedMapBase *)0x0;
      }
      aVar33 = aStack_60;
      aVar42 = aStack_68;
      if (*(UntypedMapBase **)aStack_58 <= aStack_68.data) {
        if ((ulong)table->has_bits_offset != 0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0841;
          puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar35 = *puVar35 | (uint)aVar33.data;
        }
        return (char *)aVar42.data;
      }
      uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)aStack_68;
      if ((uVar12 & 7) != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0913;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar40 = (ulong)(uVar12 & 0xfffffff8);
      aVar33.data = (ulong)*(ushort *)aStack_68 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
      UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
      hasbits = aStack_60.data;
    }
    else {
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      aStack_70 = aVar42;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    }
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                        (msg,(char *)aVar42,(ParseContext *)aStack_58,(TcFieldData)aVar33,table,
                         hasbits);
    return pcVar14;
  case 10:
    aStack_60.data = 0x1d0a65;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    if ((uVar12 & 7) != 2) {
      pcVar14 = MpRepeatedVarint<true>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    uVar9 = pFVar13->type_card;
    aStack_50.data = hasbits;
    if ((ulong)table->has_bits_offset != 0) {
      aStack_60.data = 0x1d0a8e;
      puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar35 = *puVar35 | (uint)aStack_50.data;
    }
    uVar45 = uVar9 >> 6 & 7;
    if ((uVar9 >> 6 & 7) == 0) {
      pcVar14 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
      return pcVar14;
    }
    if (uVar45 == 2) {
      pcVar14 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
      return pcVar14;
    }
    if (uVar45 == 3) {
      if ((uVar9 & 0x600) != 0) {
        aStack_48.data = CONCAT26(uVar9,aStack_48.data._0_6_) & 0x600ffffffffffff;
        LStack_40.super_LogMessage.errno_saver_.saved_errno_ = 0x200;
        aStack_60.data = 0x1d0adc;
        pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,int>
                            ((unsigned_short *)((long)&aStack_48 + 6),(int *)&LStack_40,
                             "xform_val == +field_layout::kTvZigZag");
        if (pcVar17 != (Nullable<const_char_*>)0x0) {
          aStack_60.data = 0x1d0bac;
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&LStack_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x8db,pcVar17);
          aStack_60.data = (uint64_t)MpFixed<true>;
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
        }
      }
      pcVar14 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,aStack_50.data);
      return pcVar14;
    }
    aStack_60.data = 0x1d0b90;
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0x8f9);
  case 0xb:
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0be5;
    aStack_70.data = hasbits;
    wire_bytes_00._M_len =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar9 = *(ushort *)(wire_bytes_00._M_len + 10);
    uVar45 = uVar9 & 0x30;
    if (uVar45 == 0x20) {
      pcVar14 = MpRepeatedFixed<true>
                          (msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,(uint64_t)aStack_70);
      return pcVar14;
    }
    aStack_68 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if ((uVar9 & 0x1c0) == 0xc0) {
      aStack_60 = aVar42;
      if ((uVar12 & 7) != 1) {
LAB_001d0cc3:
        UNRECOVERED_JUMPTABLE_04 = table->fallback;
        aVar29 = aStack_60;
        aVar42 = aStack_70;
        goto LAB_001d0d6e;
      }
    }
    else {
      LStack_40.super_LogMessage._0_8_ =
           CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
      aStack_58.data._6_2_ = 0x80;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0ca2;
      aStack_60 = aVar42;
      aStack_50.data = aVar33.data;
      aStack_48 = wire_bytes_00._M_len;
      pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_58 + 6),
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if (pcVar17 != (Nullable<const_char_*>)0x0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0dc0;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar17);
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0dc8;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
      }
      wire_bytes_00._M_len = aStack_48;
      aVar33 = aStack_50;
      if ((uVar12 & 7) != 5) goto LAB_001d0cc3;
    }
    aVar42 = aStack_70;
    if (uVar45 == 0x30) {
      pPVar36 = (ParseContext *)(aVar33.data >> 3 & 0x1fffffff);
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0cf7;
      ChangeOneof(table,(FieldEntry *)wire_bytes_00._M_len,(uint32_t)pPVar36,pPVar36,msg);
    }
    else if (uVar45 == 0x10) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0c72;
      anon_unknown_105::SetHas((FieldEntry *)wire_bytes_00._M_len,msg);
    }
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0d05;
    pvVar27 = MaybeGetSplitBase(msg,true,table);
    aVar29 = aStack_60;
    if ((uVar9 & 0x1c0) == 0xc0) {
      uVar38 = *(unsigned_long *)aStack_60;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0d20;
      puVar16 = RefAt<unsigned_long>(pvVar27,(ulong)*(uint *)wire_bytes_00._M_len);
      *puVar16 = uVar38;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x8;
    }
    else {
      LVar2.token_ = *(int *)aStack_60;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0d33;
      puVar35 = RefAt<unsigned_int>(pvVar27,(ulong)*(uint *)wire_bytes_00._M_len);
      *puVar35 = LVar2.token_;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x4;
    }
    aVar29.data = aVar29.data + aStack_80.data;
    if ((UntypedMapBase *)((EpsCopyInputStream *)aStack_68)->limit_end_ <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0d8f;
        puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar35 = *puVar35 | aVar42._0_4_;
      }
      return (char *)aVar29.data;
    }
    uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar12 & 7) != 0) {
      aStack_80.data = (uint64_t)MpPackedFixed<true>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar12 & 0xfffffff8);
    aVar33.data = (ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
    UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
LAB_001d0d6e:
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                        (msg,(char *)aVar29,(ParseContext *)aStack_68,(TcFieldData)aVar33,table,
                         aVar42.data);
    return pcVar14;
  case 0xc:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0e14;
    aStack_60 = aVar42;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    if ((uVar12 & 7) != 2) {
      pcVar14 = MpRepeatedFixed<true>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    uVar9 = pFVar13->type_card;
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0e3d;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    aStack_48.data = hasbits;
    pvVar27 = MaybeGetSplitBase(msg,true,table);
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0e4a;
    uVar10 = ReadSize((char **)&aStack_60);
    aStack_68 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if ((uVar9 & 0x1c0) == 0xc0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0e6d;
      aVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_long>,true>
                         (pvVar27,(ulong)pFVar13->offset,msg);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0e80;
      aVar33.data = (uint64_t)
                    EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                              (&ctx->super_EpsCopyInputStream,aStack_60.data,uVar10,
                               (RepeatedField<unsigned_long> *)aVar42);
      pPVar36 = extraout_RDX_07;
    }
    else {
      LStack_40.super_LogMessage._0_8_ =
           CONCAT62(LStack_40.super_LogMessage._2_6_,uVar9) & 0xffffffffffff01c0;
      aStack_58.data._6_2_ = 0x80;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0ec5;
      pcVar17 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          ((unsigned_short *)&LStack_40,(unsigned_short *)((long)&aStack_58 + 6),
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      if (pcVar17 != (Nullable<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0fa7;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar17);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0faf;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_40);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0ede;
      aVar42.data = (uint64_t)
                    MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_int>,true>
                              (pvVar27,(ulong)pFVar13->offset,aStack_68.data);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0ef1;
      aVar33.data = (uint64_t)
                    EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                              (&ctx->super_EpsCopyInputStream,aStack_60.data,uVar10,
                               (RepeatedField<unsigned_int> *)aVar42);
      pPVar36 = extraout_RDX_08;
    }
    wire_bytes_00._M_len = aStack_48;
    if ((ushort *)aVar33.data == (ushort *)0x0) {
      wire_bytes_00._M_len = aStack_60;
      aStack_60 = aVar33;
      pcVar14 = Error((MessageLite *)aStack_68,(char *)wire_bytes_00._M_len,pPVar36,
                      (TcFieldData)aVar42,(TcParseTableBase *)aStack_50,aStack_48.data);
      return pcVar14;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= aVar33.data) {
      if ((ulong)*(ushort *)aStack_50 != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d0f5d;
        aStack_60 = aVar33;
        puVar35 = RefAt<unsigned_int>((void *)aStack_68,(ulong)*(ushort *)aStack_50);
        *puVar35 = *puVar35 | (uint)wire_bytes_00._M_len;
      }
      return (char *)aVar33.data;
    }
    uVar12 = (uint)*(uint8_t *)(aStack_50.data + 8) & (uint)*(ushort *)aVar33;
    if ((uVar12 & 7) == 0) {
      uVar40 = (ulong)(uVar12 & 0xfffffff8);
      aStack_60 = aVar33;
      pcVar14 = (char *)(**(code **)(&((TcParseTableBase *)(aStack_50.data + 0x38))->has_bits_offset
                                    + uVar40))
                                  (aStack_68,aVar33.data,ctx,
                                   (ulong)*(ushort *)aVar33 ^
                                   *(ulong *)(&((TcParseTableBase *)(aStack_50.data + 0x38))->
                                               fast_idx_mask + uVar40 * 2),aStack_50.data,
                                   aStack_48.data);
      return pcVar14;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_001d0fc7;
    aStack_60 = aVar33;
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  case 0xd:
    aStack_60.data = 0x1d0ff7;
    uVar44 = hasbits;
    wire_bytes_00._M_len =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar43 = (uint16_t)uVar44;
    if ((uVar12 & 7) != 2) {
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      goto LAB_001d1057;
    }
    uVar9 = *(ushort *)(wire_bytes_00._M_len + 10);
    uVar45 = uVar9 & 0x30;
    if (uVar45 == 0x20) {
      aStack_50.data = hasbits;
      aStack_48 = aVar42;
      pcVar14 = MpRepeatedString<true>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    aStack_58.data = (ulong)CONCAT24(uVar9,aStack_58.data._0_4_) & 0x600ffffffff;
    LStack_40.super_LogMessage._0_8_ = ctx;
    LStack_40.super_LogMessage.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )wire_bytes_00._M_len;
    if (uVar45 == 0x10) {
      aStack_60.data = 0x1d10a0;
      aStack_50.data = hasbits;
      aStack_48 = aVar42;
      anon_unknown_105::SetHas((FieldEntry *)wire_bytes_00._M_len,msg);
      bVar8 = false;
    }
    else if (uVar45 == 0x30) {
      aStack_60.data = 0x1d10c1;
      aStack_50.data = hasbits;
      aStack_48 = aVar42;
      bVar8 = ChangeOneof(table,(FieldEntry *)wire_bytes_00._M_len,uVar12 >> 3,
                          (ParseContext *)(ulong)(uVar9 & 0x600),msg);
    }
    else {
      bVar8 = false;
      aStack_50.data = hasbits;
      aStack_48 = aVar42;
    }
    aStack_60.data = 0x1d10d8;
    pvVar27 = MaybeGetSplitBase(msg,true,table);
    NVar7._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )LStack_40.super_LogMessage.data_;
    ctx_00 = LStack_40.super_LogMessage._0_8_;
    hasbits = aStack_50.data;
    if ((uVar9 & 0x1c0) == 0x140) {
      aStack_60.data = 0x1d11aa;
      pMVar20 = RefAt<google::protobuf::internal::MicroString>
                          (pvVar27,(ulong)*(uint *)LStack_40.super_LogMessage.data_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  .
                                                  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                                  ._M_head_impl);
      hasbits = aStack_50.data;
      if (bVar8 != false) {
        pMVar20->rep_ = (void *)0x0;
      }
      pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar34 & 1) != 0) {
        pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
      }
      aStack_60.data = 0x1d11dc;
      aVar42.data = (uint64_t)
                    EpsCopyInputStream::ReadMicroString
                              ((EpsCopyInputStream *)LStack_40.super_LogMessage._0_8_,aStack_48.data
                               ,pMVar20,pAVar34);
      aStack_60.data = 0x1d11e7;
      sVar48 = MicroString::Get(pMVar20);
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)LStack_40.super_LogMessage.data_;
LAB_001d1257:
      wire_bytes_00._M_len = (uint64_t)sVar48._M_str;
      aStack_60.data = 0x1d125c;
      wire_bytes_00._M_str = (char *)table;
      bVar8 = MpVerifyUtf8((TcParser *)sVar48._M_len,wire_bytes_00,(TcParseTableBase *)aVar33,
                           (FieldEntry *)(ulong)(ushort)aStack_58.data._4_2_,uVar43);
      pPVar36 = extraout_RDX_09;
    }
    else {
      if ((uVar9 & 0x1c0) != 0x80) {
        if ((uVar9 & 0x1c0) != 0) {
          aStack_60.data = (uint64_t)&UNK_001d1379;
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0x967);
        }
        aStack_60.data = 0x1d1111;
        wire_bytes_00._M_len =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             RefAt<google::protobuf::internal::ArenaStringPtr>
                       (pvVar27,(ulong)*(uint *)LStack_40.super_LogMessage.data_._M_t.
                                                super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                .
                                                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                                ._M_head_impl);
        hasbits = aStack_50.data;
        if (bVar8 != false) {
          *(undefined8 **)wire_bytes_00._M_len = &fixed_address_empty_string;
        }
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar33.data & 1) != 0) {
          aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar33.data & 0xfffffffffffffffe))
                   ->data;
        }
        if (aVar33.data == 0) {
          aStack_60.data = 0x1d1221;
          psVar21 = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                              ((ArenaStringPtr *)wire_bytes_00._M_len,(Arena *)0x0);
          aStack_60.data = 0x1d1231;
          aVar42.data = (uint64_t)
                        InlineGreedyStringParser(psVar21,aStack_48.data,(ParseContext *)ctx_00);
        }
        else {
          aStack_60.data = 0x1d114e;
          aVar42.data = (uint64_t)
                        EpsCopyInputStream::ReadArenaString
                                  ((EpsCopyInputStream *)ctx_00,aStack_48.data,
                                   (ArenaStringPtr *)wire_bytes_00._M_len,aVar33.data);
        }
        if ((UntypedMapBase *)aVar42.data == (UntypedMapBase *)0x0) {
          aStack_60.data = 0x1d1328;
          anon_unknown_105::EnsureArenaStringIsNotDefault
                    (msg,(ArenaStringPtr *)wire_bytes_00._M_len);
          pPVar36 = extraout_RDX_11;
          goto LAB_001d1328;
        }
        sVar48._M_str = *(char **)((ulong)*(void **)wire_bytes_00._M_len & 0xfffffffffffffffc);
        sVar48._M_len =
             ((undefined8 *)((ulong)*(void **)wire_bytes_00._M_len & 0xfffffffffffffffc))[1];
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)NVar7;
        goto LAB_001d1257;
      }
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)LStack_40.super_LogMessage.data_;
      if (uVar45 == 0x30) {
        if (bVar8 == false) {
          aStack_60.data = 0x1d1268;
          ppCVar19 = RefAt<absl::lts_20250127::Cord*>
                               (msg,(ulong)*(uint *)LStack_40.super_LogMessage.data_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  .
                                                  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                                  ._M_head_impl);
          pCVar18 = *ppCVar19;
        }
        else {
          pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar34 & 1) != 0) {
            pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
          }
          aStack_60.data = 0x1d1185;
          pCVar18 = Arena::Create<absl::lts_20250127::Cord>(pAVar34);
          aStack_60.data = 0x1d1193;
          ppCVar19 = RefAt<absl::lts_20250127::Cord*>
                               (msg,(ulong)*(uint *)NVar7._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  .
                                                  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                                  ._M_head_impl);
          *ppCVar19 = pCVar18;
        }
      }
      else {
        aStack_60.data = 0x1d1207;
        pCVar18 = RefAt<absl::lts_20250127::Cord>
                            (pvVar27,(ulong)*(uint *)LStack_40.super_LogMessage.data_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                                                  .
                                                  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                                  ._M_head_impl);
        hasbits = aStack_50.data;
      }
      aStack_60.data = 0x1d127b;
      wire_bytes_00._M_len = aStack_48;
      aVar42.data = (uint64_t)InlineCordParser(pCVar18,aStack_48.data,(ParseContext *)ctx_00);
      pPVar36 = entry_00;
      if ((UntypedMapBase *)aVar42.data == (UntypedMapBase *)0x0) goto LAB_001d1328;
      aVar33.data._2_6_ = 0;
      aVar33.data._0_2_ = aStack_58.data._4_2_;
      aStack_60.data = 0x1d1291;
      MpVerifyUtf8(pCVar18,(TcParseTableBase *)wire_bytes_00._M_len,(FieldEntry *)entry_00,
                   aStack_58.data._4_2_);
      bVar8 = true;
      pPVar36 = extraout_RDX_10;
    }
    if ((bVar8 == false) || ((UntypedMapBase *)aVar42.data == (UntypedMapBase *)0x0)) {
LAB_001d1328:
      pcVar14 = Error(msg,(char *)wire_bytes_00._M_len,pPVar36,(TcFieldData)aVar33,table,hasbits);
      return pcVar14;
    }
    if (*(UntypedMapBase **)LStack_40.super_LogMessage._0_8_ <= aVar42.data) {
      if ((ulong)table->has_bits_offset != 0) {
        aStack_60.data = 0x1d12f0;
        puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar35 = *puVar35 | (uint)hasbits;
      }
      return (char *)aVar42.data;
    }
    uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar42;
    if ((uVar12 & 7) != 0) {
      aStack_60.data = 0x1d1368;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar12 & 0xfffffff8);
    aVar33.data = (ulong)*(ushort *)aVar42 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
    UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
    ctx = (ParseContext *)LStack_40.super_LogMessage._0_8_;
LAB_001d1057:
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  case 0xe:
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d13ad;
    aStack_68 = aVar42;
    aStack_60.data = hasbits;
    pFVar13 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    uVar43 = pFVar13->type_card;
    uVar9 = uVar43 & 0x30;
    if (uVar9 == 0x20) {
      if ((uVar43 & 0x1c0) == 0x40) {
        pcVar14 = MpRepeatedMessageOrGroup<true,true>
                            (msg,(char *)aStack_68,ctx,(TcFieldData)aVar33,table,aStack_60.data);
        return pcVar14;
      }
      if ((uVar43 & 0x1c0) == 0) {
        pcVar14 = MpRepeatedMessageOrGroup<true,false>
                            (msg,(char *)aStack_68,ctx,(TcFieldData)aVar33,table,aStack_60.data);
        return pcVar14;
      }
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      goto LAB_001d1492;
    }
    uVar32 = uVar12 & 7;
    if ((uVar43 & 0x1c0) == 0x40) {
      if (uVar32 != 3) goto LAB_001d1470;
    }
    else if (((uVar43 & 0x1c0) != 0) || (uVar32 != 2)) {
LAB_001d1470:
      UNRECOVERED_JUMPTABLE_04 = table->fallback;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
LAB_001d1492:
      pcVar14 = (*UNRECOVERED_JUMPTABLE_04)
                          (msg,(char *)aStack_68,ctx,(TcFieldData)aVar33,table,aStack_60.data);
      return pcVar14;
    }
    if (uVar9 == 0x30) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d14c1;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      bVar8 = ChangeOneof(table,pFVar13,(uint32_t)(wire_bytes_00._M_len >> 3),
                          (ParseContext *)(ulong)uVar32,msg);
      aStack_70.data._4_4_ = (int)CONCAT71(extraout_var_00,bVar8);
    }
    else {
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (uVar9 == 0x10) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1435;
        anon_unknown_105::SetHas(pFVar13,msg);
      }
      aStack_70.data._4_4_ = 0;
    }
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d14d3;
    paVar22 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)MaybeGetSplitBase(msg,true,table);
    if ((ulong)table->has_bits_offset != 0) {
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d14ea;
      LStack_40.super_LogMessage._0_8_ = paVar22;
      puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar35 = *puVar35 | (uint)aStack_60.data;
      paVar22 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)LStack_40.super_LogMessage._0_8_;
    }
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1501;
    ppMVar23 = RefAt<google::protobuf::MessageLite*>(paVar22,(ulong)pFVar13->offset);
    aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d151b;
    pTVar24 = GetTableFromAux(uVar43,*(FieldAux *)
                                      ((long)&table->has_bits_offset +
                                      (ulong)pFVar13->aux_idx * 8 + (ulong)table->aux_offset));
    pMVar25 = *ppMVar23;
    if ((byte)(aStack_70._4_1_ | pMVar25 == (MessageLite *)0x0) == 1) {
      pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar34 & 1) != 0) {
        pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
      }
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d154b;
      pMVar25 = ClassData::New(pTVar24->class_data,pAVar34);
      *ppMVar23 = pMVar25;
    }
    aVar42 = aStack_58;
    if ((uVar43 & 0x1c0) == 0x40) {
      iVar39 = *(int *)(aStack_58.data + 0x58);
      iVar46 = iVar39 + -1;
      *(int *)(aStack_58.data + 0x58) = iVar46;
      if (0 < iVar39) {
        iVar39 = *(int *)(aStack_58.data + 0x5c) + 1;
        *(int *)(aStack_58.data + 0x5c) = iVar39;
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1593;
        pcVar14 = ParseLoopPreserveNone(pMVar25,(char *)aStack_68,(ParseContext *)aStack_58,pTVar24)
        ;
        if (pcVar14 == (char *)0x0) {
LAB_001d15d4:
          *(ulong *)(aVar42.data + 0x58) =
               CONCAT44((int)((ulong)*(undefined8 *)(aVar42.data + 0x58) >> 0x20) + -1,
                        (int)*(undefined8 *)(aVar42.data + 0x58) + 1);
          uVar32 = *(uint32_t *)(aVar42.data + 0x50);
          *(uint32_t *)(aVar42.data + 0x50) = 0;
          if (uVar32 != uVar12) {
            return (char *)0x0;
          }
          return pcVar14;
        }
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d15af;
        pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                            (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_");
        if (pcVar26 == (Nullable<const_char_*>)0x0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d15cb;
          pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar39,*(int *)(aVar42.data + 0x5c),"old_group_depth == group_depth_"
                              );
          if (pcVar26 == (Nullable<const_char_*>)0x0) goto LAB_001d15d4;
          iVar46 = 0x492;
        }
        else {
          iVar46 = 0x491;
        }
LAB_001d1701:
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1709;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar46,pcVar26);
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_001d1711;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_50);
      }
    }
    else {
      aStack_50 = aStack_68;
      aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1618;
      ReadSize((char **)&aStack_50);
      aVar42 = aStack_58;
      if (((UntypedMapBase *)aStack_50.data != (UntypedMapBase *)0x0) &&
         (0 < *(int *)(aStack_58.data + 0x58))) {
        aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d163e;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)
                   ((long)&LStack_40.super_LogMessage.data_._M_t.
                           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                           .
                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                           ._M_head_impl + 4),(char *)aStack_58,(int)aStack_50.data);
        iVar46 = *(int *)(aVar42.data + 0x58) + -1;
        *(int *)(aVar42.data + 0x58) = iVar46;
        if ((UntypedMapBase *)aStack_50.data != (UntypedMapBase *)0x0) {
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1665;
          pcVar14 = ParseLoopPreserveNone
                              (*ppMVar23,(char *)aStack_50,(ParseContext *)aVar42,pTVar24);
          if (pcVar14 != (char *)0x0) {
            aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1680;
            pcVar26 = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_");
            if (pcVar26 != (Nullable<const_char_*>)0x0) {
              iVar46 = 0x481;
              goto LAB_001d1701;
            }
          }
          *(int *)(aVar42.data + 0x58) = *(int *)(aVar42.data + 0x58) + 1;
          aStack_50.data._0_4_ =
               LStack_40.super_LogMessage.data_._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl._4_4_;
          aStack_80 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x1d1698;
          bVar8 = EpsCopyInputStream::PopLimit
                            ((EpsCopyInputStream *)aVar42,(LimitToken *)&aStack_50);
          if (!bVar8) {
            return (char *)0x0;
          }
          return pcVar14;
        }
      }
    }
    return (char *)0x0;
  case 0xf:
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(uint16_t *)(aStack_58.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) != 0) && ((uVar12 & 7) == 2)) {
      uVar3 = *(undefined4 *)
               ((long)&table->has_bits_offset +
               (ulong)*(uint16_t *)(aStack_58.data + 8) * 8 + (ulong)table->aux_offset);
      pvVar27 = MaybeGetSplitBase(msg,true,table);
      if ((bStack_a9 & 2) == 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        pMVar28 = RefAt<google::protobuf::internal::MapFieldBaseForParse>
                            (pvVar27,(ulong)*(uint *)aStack_58);
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 MapFieldBaseForParse::MutableMap(pMVar28);
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 RefAt<google::protobuf::internal::UntypedMapBase>
                           (pvVar27,(ulong)*(uint *)aStack_58);
      }
      puVar35._4_1_ = bStack_a9;
      puVar35._0_4_ = uVar3;
      puVar35._5_3_ = 0;
      pTStack_a8 = table;
      pTStack_a0 = (TcParseTableBase *)msg;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar35;
      goto LAB_001d17e2;
    }
    pcVar14 = MpFallback(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  }
  aStack_60.data = 0x1cf9c9;
  uVar44 = hasbits;
  wire_bytes_00._M_len =
       (anon_union_8_1_898a9ca8_for_TcFieldData_0)
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,offset);
  uVar43 = (uint16_t)uVar44;
  if ((uVar12 & 7) != 2) {
    UNRECOVERED_JUMPTABLE_04 = table->fallback;
    goto LAB_001cfa2e;
  }
  uVar9 = *(uint16_t *)(wire_bytes_00._M_len + 10);
  uVar45 = uVar9 & 0x30;
  LStack_40.super_LogMessage._0_8_ = hasbits;
  if (uVar45 == 0x20) {
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48 = aVar42;
    pcVar14 = MpRepeatedString<false>(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  }
  aVar29._0_4_ = uVar9 & 0x600;
  aVar29.data._4_4_ = 0;
  aStack_50.data = (ulong)CONCAT24(uVar9,aStack_50.data._0_4_) & 0x600ffffffff;
  if (uVar45 == 0x10) {
    aStack_60.data = 0x1cfa6d;
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48 = aVar42;
    anon_unknown_105::SetHas((FieldEntry *)wire_bytes_00._M_len,msg);
LAB_001cfa93:
    bVar8 = false;
  }
  else {
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48 = aVar42;
    if (uVar45 != 0x30) goto LAB_001cfa93;
    aStack_60.data = 0x1cfa8c;
    bVar8 = ChangeOneof(table,(FieldEntry *)wire_bytes_00._M_len,uVar12 >> 3,(ParseContext *)aVar29,
                        msg);
  }
  hasbits = LStack_40.super_LogMessage._0_8_;
  wire_bytes._M_len = aStack_48;
  if ((uVar9 & 0x1c0) == 0x140) {
    aStack_60.data = 0x1cfb65;
    pMVar20 = RefAt<google::protobuf::internal::MicroString>
                        (msg,(ulong)*(uint *)wire_bytes_00._M_len);
    hasbits = LStack_40.super_LogMessage._0_8_;
    if (bVar8 != false) {
      pMVar20->rep_ = (void *)0x0;
    }
    pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar34 & 1) != 0) {
      pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
    }
    aStack_60.data = 0x1cfb94;
    aVar42.data = (uint64_t)
                  EpsCopyInputStream::ReadMicroString(aStack_58.data,aStack_48.data,pMVar20,pAVar34)
    ;
    aStack_60.data = 0x1cfb9f;
    sVar47 = MicroString::Get(pMVar20);
LAB_001cfc10:
    wire_bytes._M_len = (uint64_t)sVar47._M_str;
    aStack_60.data = 0x1cfc15;
    wire_bytes._M_str = (char *)table;
    bVar8 = MpVerifyUtf8((TcParser *)sVar47._M_len,wire_bytes,
                         (TcParseTableBase *)wire_bytes_00._M_len,
                         (FieldEntry *)(ulong)(ushort)aStack_50.data._4_2_,uVar43);
    aVar29 = wire_bytes_00._M_len;
    pPVar36 = extraout_RDX_01;
  }
  else {
    if ((uVar9 & 0x1c0) != 0x80) {
      if ((uVar9 & 0x1c0) != 0) {
        aStack_60.data = (uint64_t)&UNK_001cfd35;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aStack_60.data = 0x1cfac7;
      LStack_40.super_LogMessage.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )wire_bytes_00._M_len;
      wire_bytes._M_len =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::internal::ArenaStringPtr>
                     (msg,(ulong)*(uint *)wire_bytes_00._M_len);
      hasbits = LStack_40.super_LogMessage._0_8_;
      aVar42 = aStack_48;
      if (bVar8 != false) {
        *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
      }
      aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar29.data & 1) != 0) {
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar29.data & 0xfffffffffffffffe))->
                 data;
      }
      if (aVar29.data == 0) {
        aStack_60.data = 0x1cfbd8;
        psVar21 = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                            ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
        aStack_60.data = 0x1cfbe7;
        aVar42.data = (uint64_t)InlineGreedyStringParser(psVar21,aVar42.data,aStack_58.data);
      }
      else {
        aStack_60.data = 0x1cfb08;
        aVar42.data = (uint64_t)
                      EpsCopyInputStream::ReadArenaString
                                (aStack_58.data,aStack_48.data,(ArenaStringPtr *)wire_bytes._M_len,
                                 aVar29.data);
      }
      if ((UntypedMapBase *)aVar42.data == (UntypedMapBase *)0x0) {
        aStack_60.data = 0x1cfce4;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
        pPVar36 = extraout_RDX_03;
        goto LAB_001cfce4;
      }
      sVar47._M_str = *(char **)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar47._M_len = ((undefined8 *)((ulong)*(void **)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      wire_bytes_00._M_len =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)LStack_40.super_LogMessage.data_;
      goto LAB_001cfc10;
    }
    if (uVar45 == 0x30) {
      if (bVar8 == false) {
        aStack_60.data = 0x1cfc22;
        ppCVar19 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)wire_bytes_00._M_len);
        pCVar18 = *ppCVar19;
        wire_bytes._M_len = aStack_48;
      }
      else {
        pAVar34 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar34 & 1) != 0) {
          pAVar34 = *(Arena **)((ulong)pAVar34 & 0xfffffffffffffffe);
        }
        aStack_60.data = 0x1cfb41;
        pCVar18 = Arena::Create<absl::lts_20250127::Cord>(pAVar34);
        aStack_60.data = 0x1cfb4f;
        ppCVar19 = RefAt<absl::lts_20250127::Cord*>(msg,(ulong)*(uint *)wire_bytes_00._M_len);
        *ppCVar19 = pCVar18;
      }
    }
    else {
      aStack_60.data = 0x1cfbc1;
      pCVar18 = RefAt<absl::lts_20250127::Cord>(msg,(ulong)*(uint *)wire_bytes_00._M_len);
      wire_bytes._M_len = aStack_48;
      hasbits = LStack_40.super_LogMessage._0_8_;
    }
    aStack_60.data = 0x1cfc39;
    aVar42.data = (uint64_t)InlineCordParser(pCVar18,wire_bytes._M_len,aStack_58.data);
    pPVar36 = entry;
    if ((UntypedMapBase *)aVar42.data == (UntypedMapBase *)0x0) goto LAB_001cfce4;
    aVar29.data._2_6_ = 0;
    aVar29.data._0_2_ = aStack_50.data._4_2_;
    aStack_60.data = 0x1cfc4f;
    MpVerifyUtf8(pCVar18,(TcParseTableBase *)wire_bytes._M_len,(FieldEntry *)entry,
                 aStack_50.data._4_2_);
    bVar8 = true;
    pPVar36 = extraout_RDX_02;
  }
  if ((bVar8 != false) && ((UntypedMapBase *)aVar42.data != (UntypedMapBase *)0x0)) {
    if (*(UntypedMapBase **)aStack_58 <= aVar42.data) {
      if ((ulong)table->has_bits_offset != 0) {
        aStack_60.data = 0x1cfcac;
        puVar35 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar35 = *puVar35 | (uint)hasbits;
      }
      return (char *)aVar42.data;
    }
    uVar12 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar42;
    if ((uVar12 & 7) != 0) {
      aStack_60.data = 0x1cfd24;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar40 = (ulong)(uVar12 & 0xfffffff8);
    aVar33.data = (ulong)*(ushort *)aVar42 ^ *(ulong *)(&table[1].fast_idx_mask + uVar40 * 2);
    UNRECOVERED_JUMPTABLE_04 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar40);
    ctx = (ParseContext *)aStack_58;
LAB_001cfa2e:
    pcVar14 = (*UNRECOVERED_JUMPTABLE_04)(msg,(char *)aVar42,ctx,(TcFieldData)aVar33,table,hasbits);
    return pcVar14;
  }
LAB_001cfce4:
  pcVar14 = Error(msg,(char *)wire_bytes._M_len,pPVar36,(TcFieldData)aVar29,table,hasbits);
  return pcVar14;
code_r0x001d19af:
  uVar11 = (uint)UNRECOVERED_JUMPTABLE & 0xf;
  puVar35 = &switchD_001d19c0::switchdataD_00270794;
  UNRECOVERED_JUMPTABLE =
       (code *)((long)&switchD_001d19c0::switchdataD_00270794 +
               (long)(int)(&switchD_001d19c0::switchdataD_00270794)[uVar11]);
  switch(uVar11) {
  case 0:
    pcVar14 = (char *)aVar29;
    msg_00 = aVar33;
code_r0x001d19c8:
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)msg_00,(KeyNode *)pcVar14);
    break;
  case 1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)aVar33,(KeyNode *)aVar29);
    break;
  case 2:
    pcVar14 = (char *)aVar29;
    msg_00 = aVar33;
code_r0x001d19d5:
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)msg_00,(KeyNode *)pcVar14);
    break;
  default:
    goto switchD_001d19c0_caseD_3;
  case 5:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)aVar33,(KeyNode *)aVar29);
    break;
  case 6:
    goto switchD_001d19c0_caseD_6;
  case 7:
    pcVar14 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                        ((MessageLite *)msg_00,pcVar14,(ParseContext *)aVar37,(TcFieldData)0x270794,
                         pTVar24,aVar33.data);
    return pcVar14;
  case 8:
    goto switchD_001d19c0_caseD_8;
  case 9:
    goto switchD_001d19c0_caseD_9;
  case 10:
    *(int *)UNRECOVERED_JUMPTABLE = *(int *)UNRECOVERED_JUMPTABLE + (int)UNRECOVERED_JUMPTABLE;
    msg_00.data._0_4_ = (uint)(msg_00.data >> 9) & 3;
    msg_00.data._4_4_ = 0;
    goto code_r0x001d54a2;
  case 0xc:
    pcVar14 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
    ;
  case 0xb:
    protobuf_assumption_failed((char *)msg_00,pcVar14,0x452);
  case 0xd:
    lVar15 = CONCAT71((int7)((ulong)UNRECOVERED_JUMPTABLE >> 8),(char)UNRECOVERED_JUMPTABLE + '\a');
    pcVar14 = (char *)(lVar15 + -0x7cf6103f);
    *pcVar14 = *pcVar14 + (char)aVar37.data + -0x12;
    out(3,(int)lVar15);
code_r0x001d54a2:
    pcVar14 = (char *)(*(code *)((long)&switchD_001d54b0::switchdataD_002707bc +
                                (long)(int)(&switchD_001d54b0::switchdataD_002707bc)[msg_00.data]))
                                ();
    return pcVar14;
  case 0xe:
    return (char *)UNRECOVERED_JUMPTABLE;
  case 0xf:
    return (char *)UNRECOVERED_JUMPTABLE;
  }
  do {
    if (*(ushort **)aVar42 <= puVar30) {
      if ((ulong)pTStack_a8->has_bits_offset != 0) {
        puVar35 = RefAt<unsigned_int>(pTStack_a0,(ulong)pTStack_a8->has_bits_offset);
        *puVar35 = *puVar35 | uVar32;
      }
      return (char *)puVar30;
    }
    bVar1 = (byte)*puVar30;
    uVar11 = (uint)bVar1;
    aVar42.data = (long)puVar30 + 1;
    if ((char)bVar1 < '\0') {
      uVar41 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar15 = CONCAT71(uVar41,*(char *)aVar42);
      if (*(char *)aVar42 < '\0') {
        uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
        lVar15 = CONCAT71(uVar41,(byte)puVar30[1]);
        if ((char)(byte)puVar30[1] < '\0') {
          uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
          lVar15 = CONCAT71(uVar41,*(byte *)((long)puVar30 + 3));
          if ((char)*(byte *)((long)puVar30 + 3) < '\0') {
            uVar41 = uVar41 >> 7 | (uint7)((ulong)(lVar15 << 0x39) >> 8);
            if ((char)(byte)puVar30[2] < '\0') {
              uVar11 = 0;
              aVar42.data = 0;
            }
            else {
              uVar11 = (int)CONCAT71(uVar41,(byte)puVar30[2]) << 0x1c | (uint)(uVar41 >> 0x1c);
              aVar42.data = (long)puVar30 + 5;
            }
          }
          else {
            uVar11 = (int)lVar15 << 0x15 | (uint)(uVar41 >> 0x23);
            aVar42.data = (uint64_t)(puVar30 + 2);
          }
        }
        else {
          uVar11 = (int)lVar15 << 0xe | (uint)(uVar41 >> 0x2a);
          aVar42.data = (long)puVar30 + 3;
        }
      }
      else {
        uVar11 = (int)lVar15 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        aVar42.data = (uint64_t)(puVar30 + 1);
      }
    }
    if (uVar11 != uVar12) {
      uVar12 = (uint)(byte)((InternalMetadata *)&pTStack_a8->fast_idx_mask)->ptr_ & (uint)*puVar30;
      if ((uVar12 & 7) == 0) {
        uVar40 = (ulong)(uVar12 & 0xfffffff8);
        pcVar14 = (char *)(**(code **)(&pTStack_a8[1].has_bits_offset + uVar40))
                                    (pTStack_a0,puVar30,aStack_60.data,
                                     (ulong)*puVar30 ^
                                     *(ulong *)(&pTStack_a8[1].fast_idx_mask + uVar40 * 2),
                                     pTStack_a8,hasbits);
        return pcVar14;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
LAB_001d17e2:
    aVar29.data = (uint64_t)UntypedMapBase::AllocNode(aVar33.data);
    uVar9 = *(ushort *)(aVar33.data + 0xc);
    aStack_78.data = (ulong)uVar9 - 8;
    aStack_48.data = 8;
    UNRECOVERED_JUMPTABLE =
         (code *)absl::lts_20250127::log_internal::Check_GEImpl<long,unsigned_long>
                           ((long *)&aStack_78.data,&aStack_48.data,
                            "node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      pcVar14 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      aVar33.data = (uint64_t)&aStack_78;
      iVar46 = 0xb2c;
      goto LAB_001d1c0a;
    }
    *(undefined8 *)(aVar29.data + 8) = 0;
    *(undefined8 *)((long)(aVar29.data - 8) + (ulong)uVar9) = 0;
    pcVar14 = (char *)aVar29;
    UntypedMapBase::
    VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>
              ((UntypedMapBase *)aVar33,(NodeBase *)aVar29,
               (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
                )aVar33);
    LStack_40.super_LogMessage._0_8_ = &aStack_88;
    aStack_68.data = (uint64_t)&aStack_80;
    f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)&aStack_48;
    f_00.this = (UntypedMapBase *)aVar33.data;
    f_00.node = (NodeBase **)aStack_68.data;
    aStack_80 = aVar29;
    aStack_78 = aVar33;
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&aStack_48;
    aStack_48 = aVar33;
    LStack_40.super_LogMessage.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )aVar33;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar33,f_00);
    aStack_78 = aVar42;
    uVar10 = ReadSize((char **)&aStack_78);
    aVar42 = aStack_60;
    aVar37 = aStack_78;
    if (((UntypedMapBase *)aStack_78.data == (UntypedMapBase *)0x0) ||
       (*(int *)(aStack_60.data + 0x58) < 1)) {
LAB_001d1b00:
      if (*(long *)(aVar33.data + 0x18) == 0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)aVar33,(NodeBase *)aVar29);
        aVar37 = extraout_RDX_14;
        pcVar14 = (char *)aVar29;
      }
      pcVar14 = Error((MessageLite *)pTStack_a0,pcVar14,(ParseContext *)aVar37,(TcFieldData)puVar35,
                      pTStack_a8,hasbits);
      return pcVar14;
    }
    puVar35._4_4_ = 0;
    puVar35._0_4_ = uVar10;
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&aStack_48,(char *)aStack_60,(int)aStack_78.data);
    uVar3 = aStack_48.data._0_4_;
    iVar46 = *(int *)(aVar42.data + 0x58) + -1;
    *(int *)(aVar42.data + 0x58) = iVar46;
    aVar37 = extraout_RDX_12;
    pcVar14 = (char *)aStack_78;
    if ((UntypedMapBase *)aStack_78.data == (UntypedMapBase *)0x0) goto LAB_001d1b00;
    puVar35 = (uint *)aStack_88;
    pTVar24 = pTStack_a8;
    puVar30 = (ushort *)
              ParseOneMapEntry((NodeBase *)aVar29,(char *)aStack_78,(ParseContext *)aVar42,
                               (FieldAux *)aStack_88,pTStack_a8,(FieldEntry *)aStack_58,
                               (UntypedMapBase *)aVar33);
    if ((puVar30 != (ushort *)0x0) &&
       (UNRECOVERED_JUMPTABLE =
             (code *)absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar46,*(int *)(aVar42.data + 0x58),"old_depth == depth_"),
       UNRECOVERED_JUMPTABLE != (code *)0x0)) {
      pcVar14 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
      ;
      aVar33.data = (uint64_t)&aStack_78;
      goto switchD_001d0359_caseD_9;
    }
    *(int *)(aVar42.data + 0x58) = *(int *)(aVar42.data + 0x58) + 1;
    aStack_80.data._0_4_ = uVar3;
    pcVar14 = (char *)&aStack_80;
    msg_00 = aVar42;
    bVar8 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)aVar42,(LimitToken *)pcVar14);
    aVar37 = extraout_RDX_13;
    if ((!bVar8) || (puVar30 == (ushort *)0x0)) goto LAB_001d1b00;
    if ((bStack_a9 & 0x10) == 0) break;
    puVar35 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar33,(NodeBase *)aVar29);
    uVar11 = *puVar35;
    puVar35 = *(uint **)(aStack_88.data + 8);
    pcVar14 = (char *)(long)(short)*puVar35;
    msg_00.data._0_4_ = *puVar35 >> 0x10;
    msg_00.data._4_4_ = 0;
    aVar37.data = ((long)(int)uVar11 - (long)pcVar14) - msg_00.data;
    if ((UntypedMapBase *)((long)(int)uVar11 - (long)pcVar14) < msg_00.data) break;
    uVar4 = puVar35[1];
    pcVar14._4_4_ = 0;
    pcVar14._0_4_ = uVar4;
    msg_00.data._2_6_ = 0;
    msg_00.data._0_2_ = (ushort)uVar4;
    if (aVar37.data < msg_00.data) {
      if ((puVar35[(aVar37.data >> 5) + 2] >> ((uint)aVar37.data & 0x1f) & 1) != 0) break;
    }
    else {
      aVar37.data._4_4_ = 0;
      aVar37.data._0_4_ = uVar4 >> 0x10;
      pcVar14 = (char *)0x0;
      while (pcVar14 < aVar37.data) {
        uVar5 = *(uint *)((long)puVar35 + (long)pcVar14 * 4 + (ulong)(uVar4 >> 3 & 0x1ffc) + 8);
        msg_00.data._4_4_ = 0;
        msg_00.data._0_4_ = uVar5;
        pTVar24 = (TcParseTableBase *)(ulong)((int)uVar11 < (int)uVar5);
        pcVar14 = (char *)(((long)pcVar14 * 2 - (long)pTVar24) + 2);
        if (uVar5 == uVar11) goto LAB_001d199b;
      }
    }
    puVar35 = (uint *)wire_bytes_00._M_len;
    WriteMapEntryAsUnknown
              ((MessageLite *)pTStack_a0,pTStack_a8,(UntypedMapBase *)aVar33,uVar12,
               (NodeBase *)aVar29,SUB85(aStack_50.data,0));
  } while( true );
LAB_001d199b:
  UNRECOVERED_JUMPTABLE = (code *)(ulong)(*(uint *)(aVar33.data + 0xc) >> 0x18);
  if (5 < ((byte)(*(uint *)(aVar33.data + 0xc) >> 0x18) & 0xf)) {
switchD_001d19c0_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x001d19af;
switchD_001d19c0_caseD_9:
  pcVar14 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                      ((MessageLite *)msg_00,pcVar14,(ParseContext *)aVar37,(TcFieldData)puVar35,
                       pTVar24,aVar33.data);
  return pcVar14;
switchD_001d19c0_caseD_8:
  pcVar14 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)0>
                      ((MessageLite *)msg_00,pcVar14,(ParseContext *)aVar37,(TcFieldData)puVar35,
                       pTVar24,aVar33.data);
  return pcVar14;
switchD_001d19c0_caseD_6:
  pcVar14 = (char *)(*UNRECOVERED_JUMPTABLE)();
  return pcVar14;
switchD_001d0359_caseD_9:
  iVar46 = 0x481;
LAB_001d1c0a:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aVar33,pcVar14,iVar46,(Nonnull<const_char_*>)UNRECOVERED_JUMPTABLE);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aVar33);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MiniParse(
    PROTOBUF_TC_PARAM_NO_DATA_DECL) {
  PROTOBUF_MUSTTAIL return MiniParse<false>(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}